

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert_word_matcher.hpp
# Opt level: O0

bool boost::xpressive::detail::word_boundary<mpl_::bool_<true>>::
     eval<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
               (bool prevword,bool thisword,
               match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *state)

{
  bool bVar1;
  match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  byte in_SIL;
  byte in_DIL;
  bool local_1;
  
  if (((((in_RDX->flags_).match_not_bow_ & 1U) != 0) &&
      (bVar1 = match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::bos((match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x15e561), bVar1)) ||
     ((((in_RDX->flags_).match_not_eow_ & 1U) != 0 &&
      (bVar1 = match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::eos(in_RDX), bVar1)))) {
    local_1 = false;
  }
  else {
    local_1 = (in_DIL & 1) != (in_SIL & 1);
  }
  return local_1;
}

Assistant:

static bool eval(bool prevword, bool thisword, match_state<BidiIter> &state)
        {
            if((state.flags_.match_not_bow_ && state.bos()) || (state.flags_.match_not_eow_ && state.eos()))
            {
                return !IsBoundary::value;
            }

            return IsBoundary::value == (prevword != thisword);
        }